

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

DdNode * cuddZddGetNodeIVO(DdManager *dd,int index,DdNode *g,DdNode *h)

{
  int *piVar1;
  DdNode *f;
  DdNode *P;
  DdNode *pDVar2;
  
  f = cuddUniqueInterZdd(dd,index,dd->one,dd->zero);
  if (f != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    P = cuddZddProduct(dd,f,g);
    if (P != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDerefZdd(dd,f);
      pDVar2 = cuddZddUnion(dd,P,h);
      f = P;
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDerefZdd(dd,P);
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar2;
      }
    }
    Cudd_RecursiveDerefZdd(dd,f);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddZddGetNodeIVO(
  DdManager * dd,
  int  index,
  DdNode * g,
  DdNode * h)
{
    DdNode      *f, *r, *t;
    DdNode      *zdd_one = DD_ONE(dd);
    DdNode      *zdd_zero = DD_ZERO(dd);

    f = cuddUniqueInterZdd(dd, index, zdd_one, zdd_zero);
    if (f == NULL) {
        return(NULL);
    }
    cuddRef(f);
    t = cuddZddProduct(dd, f, g);
    if (t == NULL) {
        Cudd_RecursiveDerefZdd(dd, f);
        return(NULL);
    }
    cuddRef(t);
    Cudd_RecursiveDerefZdd(dd, f);
    r = cuddZddUnion(dd, t, h);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        return(NULL);
    }
    cuddRef(r);
    Cudd_RecursiveDerefZdd(dd, t);

    cuddDeref(r);
    return(r);

}